

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

cmpResult __thiscall
llvm::detail::DoubleAPFloat::compareAbsoluteValue(DoubleAPFloat *this,DoubleAPFloat *RHS)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  type pAVar4;
  type pAVar5;
  int RHSAgainst;
  int Against;
  cmpResult Result;
  DoubleAPFloat *RHS_local;
  DoubleAPFloat *this_local;
  
  pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&this->Floats,0);
  pAVar5 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                     (&RHS->Floats,0);
  this_local._4_4_ = APFloat::compareAbsoluteValue(pAVar4,pAVar5);
  if (this_local._4_4_ == cmpEqual) {
    pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&this->Floats,1);
    pAVar5 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                       (&RHS->Floats,1);
    this_local._4_4_ = APFloat::compareAbsoluteValue(pAVar4,pAVar5);
    if ((this_local._4_4_ == cmpLessThan) || (this_local._4_4_ == cmpGreaterThan)) {
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,0);
      bVar1 = APFloat::isNegative(pAVar4);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&this->Floats,1);
      bVar2 = APFloat::isNegative(pAVar4);
      bVar1 = bVar1 != bVar2;
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&RHS->Floats,0);
      bVar2 = APFloat::isNegative(pAVar4);
      pAVar4 = std::unique_ptr<llvm::APFloat[],_std::default_delete<llvm::APFloat[]>_>::operator[]
                         (&RHS->Floats,1);
      bVar3 = APFloat::isNegative(pAVar4);
      bVar2 = bVar2 != bVar3;
      if ((!bVar1) || (bVar2)) {
        if ((bVar1) || (!bVar2)) {
          if ((((bVar1) || (bVar2)) && (bVar1)) && (bVar2)) {
            this_local._4_4_ = cmpGreaterThan - this_local._4_4_;
          }
        }
        else {
          this_local._4_4_ = cmpGreaterThan;
        }
      }
      else {
        this_local._4_4_ = cmpLessThan;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

APFloat::cmpResult
DoubleAPFloat::compareAbsoluteValue(const DoubleAPFloat &RHS) const {
  auto Result = Floats[0].compareAbsoluteValue(RHS.Floats[0]);
  if (Result != cmpEqual)
    return Result;
  Result = Floats[1].compareAbsoluteValue(RHS.Floats[1]);
  if (Result == cmpLessThan || Result == cmpGreaterThan) {
    auto Against = Floats[0].isNegative() ^ Floats[1].isNegative();
    auto RHSAgainst = RHS.Floats[0].isNegative() ^ RHS.Floats[1].isNegative();
    if (Against && !RHSAgainst)
      return cmpLessThan;
    if (!Against && RHSAgainst)
      return cmpGreaterThan;
    if (!Against && !RHSAgainst)
      return Result;
    if (Against && RHSAgainst)
      return (cmpResult)(cmpLessThan + cmpGreaterThan - Result);
  }
  return Result;
}